

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManSpecReduceInit(Gia_Man_t *p,Abc_Cex_t *pInit,int nFrames,int fDualOut)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *vXorLits_00;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_60;
  int iLitNew;
  int i;
  int f;
  Vec_Int_t *vXorLits;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fDualOut_local;
  int nFrames_local;
  Abc_Cex_t *pInit_local;
  Gia_Man_t *p_local;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManSpecReduceInit(): Equivalence classes are not available.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    iVar1 = Gia_ManRegNum(p);
    if (iVar1 == 0) {
      Abc_Print(1,"Gia_ManSpecReduceInit(): Circuit is not sequential.\n");
      p_local = (Gia_Man_t *)0x0;
    }
    else {
      iVar1 = Gia_ManRegNum(p);
      if (iVar1 == pInit->nRegs) {
        if ((fDualOut == 0) || (uVar2 = Gia_ManPoNum(p), (uVar2 & 1) == 0)) {
          iVar1 = pInit->nRegs;
          iVar3 = Gia_ManRegNum(p);
          if ((iVar1 != iVar3) || (pInit->nPis != 0)) {
            __assert_fail("pInit->nRegs == Gia_ManRegNum(p) && pInit->nPis == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x553,
                          "Gia_Man_t *Gia_ManSpecReduceInit(Gia_Man_t *, Abc_Cex_t *, int, int)");
          }
          iVar1 = Gia_ManObjNum(p);
          Vec_IntFill(&p->vCopies,nFrames * iVar1,-1);
          vXorLits_00 = Vec_IntAlloc(1000);
          Gia_ManSetPhase(p);
          if (fDualOut != 0) {
            Gia_ManEquivSetColors(p,0);
          }
          iVar1 = Gia_ManObjNum(p);
          p_00 = Gia_ManStart(nFrames * iVar1);
          pcVar4 = Abc_UtilStrsav(p->pName);
          p_00->pName = pcVar4;
          pcVar4 = Abc_UtilStrsav(p->pSpec);
          p_00->pSpec = pcVar4;
          Gia_ManHashAlloc(p_00);
          local_60 = 0;
          while( true ) {
            iVar1 = Gia_ManRegNum(p);
            bVar6 = false;
            if (local_60 < iVar1) {
              iVar1 = Gia_ManPiNum(p);
              pObjRi = Gia_ManCi(p,iVar1 + local_60);
              bVar6 = pObjRi != (Gia_Obj_t *)0x0;
            }
            if (!bVar6) break;
            iVar1 = Abc_InfoHasBit((uint *)(pInit + 1),local_60);
            Gia_ObjSetCopyF(p,0,pObjRi,iVar1);
            local_60 = local_60 + 1;
          }
          for (iLitNew = 0; iLitNew < nFrames; iLitNew = iLitNew + 1) {
            pGVar5 = Gia_ManConst0(p);
            Gia_ObjSetCopyF(p,iLitNew,pGVar5,0);
            local_60 = 0;
            while( true ) {
              iVar1 = Gia_ManPiNum(p);
              bVar6 = false;
              if (local_60 < iVar1) {
                pObjRi = Gia_ManCi(p,local_60);
                bVar6 = pObjRi != (Gia_Obj_t *)0x0;
              }
              if (!bVar6) break;
              iVar1 = Gia_ManAppendCi(p_00);
              Gia_ObjSetCopyF(p,iLitNew,pObjRi,iVar1);
              local_60 = local_60 + 1;
            }
            local_60 = 0;
            while( true ) {
              iVar1 = Gia_ManRegNum(p);
              bVar6 = false;
              if (local_60 < iVar1) {
                iVar1 = Gia_ManPiNum(p);
                pObjRi = Gia_ManCi(p,iVar1 + local_60);
                bVar6 = pObjRi != (Gia_Obj_t *)0x0;
              }
              if (!bVar6) break;
              Gia_ManSpecBuildInit(p_00,p,pObjRi,vXorLits_00,iLitNew,fDualOut);
              local_60 = local_60 + 1;
            }
            local_60 = 0;
            while( true ) {
              iVar1 = Vec_IntSize(p->vCos);
              bVar6 = false;
              if (local_60 < iVar1) {
                pObjRi = Gia_ManCo(p,local_60);
                bVar6 = pObjRi != (Gia_Obj_t *)0x0;
              }
              if (!bVar6) break;
              pGVar5 = Gia_ObjFanin0(pObjRi);
              Gia_ManSpecReduceInit_rec(p_00,p,pGVar5,vXorLits_00,iLitNew,fDualOut);
              iVar1 = Gia_ObjFanin0CopyF(p,iLitNew,pObjRi);
              Gia_ObjSetCopyF(p,iLitNew,pObjRi,iVar1);
              local_60 = local_60 + 1;
            }
            if (iLitNew == nFrames + -1) break;
            local_60 = 0;
            while( true ) {
              iVar1 = Gia_ManRegNum(p);
              bVar6 = false;
              if (local_60 < iVar1) {
                iVar1 = Gia_ManPoNum(p);
                pObjRo = Gia_ManCo(p,iVar1 + local_60);
                bVar6 = false;
                if (pObjRo != (Gia_Obj_t *)0x0) {
                  iVar1 = Gia_ManPiNum(p);
                  vXorLits = (Vec_Int_t *)Gia_ManCi(p,iVar1 + local_60);
                  bVar6 = vXorLits != (Vec_Int_t *)0x0;
                }
              }
              if (!bVar6) break;
              iVar1 = Gia_ObjCopyF(p,iLitNew,pObjRo);
              Gia_ObjSetCopyF(p,iLitNew + 1,(Gia_Obj_t *)vXorLits,iVar1);
              local_60 = local_60 + 1;
            }
          }
          for (local_60 = 0; iVar1 = Vec_IntSize(vXorLits_00), local_60 < iVar1;
              local_60 = local_60 + 1) {
            iVar1 = Vec_IntEntry(vXorLits_00,local_60);
            Gia_ManAppendCo(p_00,iVar1);
          }
          iVar1 = Vec_IntSize(vXorLits_00);
          if (iVar1 == 0) {
            Gia_ManAppendCo(p_00,0);
          }
          Vec_IntErase(&p->vCopies);
          Vec_IntFree(vXorLits_00);
          Gia_ManHashStop(p_00);
          p_local = Gia_ManCleanup(p_00);
          Gia_ManStop(p_00);
        }
        else {
          Abc_Print(1,"Gia_ManSpecReduceInit(): Dual-output miter should have even number of POs.\n"
                   );
          p_local = (Gia_Man_t *)0x0;
        }
      }
      else {
        Abc_Print(1,"Gia_ManSpecReduceInit(): Mismatch in the number of registers.\n");
        p_local = (Gia_Man_t *)0x0;
      }
    }
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceInit( Gia_Man_t * p, Abc_Cex_t * pInit, int nFrames, int fDualOut )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    Vec_Int_t * vXorLits;
    int f, i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( Gia_ManRegNum(p) == 0 )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Circuit is not sequential.\n" );
        return NULL;
    }
    if ( Gia_ManRegNum(p) != pInit->nRegs )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Mismatch in the number of registers.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }

/*
    if ( !Gia_ManCheckTopoOrder( p ) )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): AIG is not in a correct topological order.\n" );
        return NULL;
    }
*/
    assert( pInit->nRegs == Gia_ManRegNum(p) && pInit->nPis == 0 );
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, 0 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Abc_InfoHasBit(pInit->pData, i) );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachRo( p, pObj, i )
            Gia_ManSpecBuildInit( pNew, p, pObj, vXorLits, f, fDualOut );
        Gia_ManForEachCo( p, pObj, i )
        {
            Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, f, fDualOut );
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        }
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
//        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Vec_IntErase( &p->vCopies );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}